

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

SubpassMetaStorage *
Fossilize::StateRecorder::Impl::analyze_subpass_meta_storage<VkRenderPassCreateInfo>
          (SubpassMetaStorage *__return_storage_ptr__,VkRenderPassCreateInfo *info)

{
  uint32_t uVar1;
  bool bVar2;
  SubpassMetaStorage *local_58;
  uint32_t *mask;
  uint local_20;
  bool uses_depth_stencil;
  bool uses_color;
  uint32_t i;
  VkRenderPassCreateInfo *info_local;
  SubpassMetaStorage *storage;
  
  __return_storage_ptr__->embedded = 0;
  __return_storage_ptr__->subpass_count = 0;
  memset(&__return_storage_ptr__->fallback,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&__return_storage_ptr__->fallback);
  __return_storage_ptr__->subpass_count = info->subpassCount;
  if (0x10 < info->subpassCount) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&__return_storage_ptr__->fallback,(ulong)(info->subpassCount - 1 >> 4));
  }
  for (local_20 = 0; local_20 < info->subpassCount; local_20 = local_20 + 1) {
    uVar1 = info->pSubpasses[local_20].colorAttachmentCount;
    bVar2 = false;
    if (info->pSubpasses[local_20].pDepthStencilAttachment != (VkAttachmentReference *)0x0) {
      bVar2 = (info->pSubpasses[local_20].pDepthStencilAttachment)->attachment != 0xffffffff;
    }
    local_58 = __return_storage_ptr__;
    if (0xf < local_20) {
      local_58 = (SubpassMetaStorage *)
                 std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&__return_storage_ptr__->fallback,(ulong)(local_20 - 0x10 >> 4));
    }
    if (uVar1 != 0) {
      local_58->embedded = 1 << (sbyte)((local_20 & 0xf) << 1) | local_58->embedded;
    }
    if (bVar2) {
      local_58->embedded = 1 << ((char)((local_20 & 0xf) << 1) + 1U & 0x1f) | local_58->embedded;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

StateRecorder::Impl::SubpassMetaStorage StateRecorder::Impl::analyze_subpass_meta_storage(const CreateInfo &info)
{
	SubpassMetaStorage storage = {};

	storage.subpass_count = info.subpassCount;
	if (info.subpassCount > 16)
		storage.fallback.resize(((info.subpassCount - 16) + 15) / 16);

	for (uint32_t i = 0; i < info.subpassCount; i++)
	{
		bool uses_color = info.pSubpasses[i].colorAttachmentCount > 0;
		bool uses_depth_stencil =
				info.pSubpasses[i].pDepthStencilAttachment != nullptr &&
				info.pSubpasses[i].pDepthStencilAttachment->attachment != VK_ATTACHMENT_UNUSED;

		uint32_t &mask = i < 16 ? storage.embedded : storage.fallback[(i - 16) / 16];
		if (uses_color)
			mask |= 1u << (2 * (i & 15) + 0);
		if (uses_depth_stencil)
			mask |= 1u << (2 * (i & 15) + 1);
	}

	return storage;
}